

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::TableDrivenEnabled
          (anon_unknown_0 *this,Descriptor *descriptor,Options *options)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  if (((((ulong)options & 1) != 0) && (*(int *)(this + 0x68) == 0)) &&
     ((((ulong)descriptor & 1) != 0 ||
      (*(int *)(*(long *)(*(long *)(this + 0x10) + 0xa0) + 0xa8) == 3)))) {
    iVar4 = 0;
    if (*(int *)(*(long *)(this + 0x10) + 0x8c) == 3) {
      return false;
    }
    iVar3 = *(int *)(this + 0x2c);
    if (0 < iVar3) {
      lVar7 = 0;
      lVar6 = 0;
      iVar5 = 0;
      do {
        lVar1 = *(long *)(this + 0x30);
        iVar4 = *(int *)(lVar1 + 0x38 + lVar7);
        if (iVar4 < iVar5) {
          iVar4 = iVar5;
        }
        bVar2 = FieldDescriptor::is_map((FieldDescriptor *)(lVar7 + lVar1));
        if (bVar2) {
          return false;
        }
        if (*(long *)(lVar1 + 0x60 + lVar7) != 0) {
          return false;
        }
        if (*(char *)(*(long *)(lVar1 + 0x80 + lVar7) + 0x6f) != '\0') {
          return false;
        }
        lVar6 = lVar6 + 1;
        iVar3 = *(int *)(this + 0x2c);
        lVar7 = lVar7 + 0xa8;
        iVar5 = iVar4;
      } while (lVar6 < iVar3);
      if (0x7fff < iVar4) {
        return false;
      }
    }
    if ((double)iVar4 * 0.5 < (double)iVar3) {
      return (bool)(*(byte *)(*(long *)(this + 0x20) + 0x6b) ^ 1);
    }
  }
  return false;
}

Assistant:

bool TableDrivenEnabled(const Descriptor* descriptor, const Options& options) {
  if (!options.table_driven_parsing) {
    return false;
  }

  // Consider table-driven parsing.  We only do this if:
  // - There are no extensions
  if (descriptor->extension_range_count() != 0) {
    return false;
  }

  // - We are not using UnknownFieldSet (part of the non-lite library).
  if (UseUnknownFieldSet(descriptor->file(), options)) {
    return false;
  }

  // - We have has_bits for fields.  This avoids a check on every field we set
  //   when are present (the common case).
  if (!HasFieldPresence(descriptor->file())) {
    return false;
  }

  const double table_sparseness = 0.5;
  int max_field_number = 0;
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    if (max_field_number < field->number()) {
      max_field_number = field->number();
    }

    // - There are no map fields.
    if (field->is_map()) {
      return false;
    }

    // - There are no oneof fields.
    if (field->containing_oneof()) {
      return false;
    }

    // - There are no weak fields.
    if (field->options().weak()) {
      return false;
    }
  }

  // - There range of field numbers is "small"
  if (max_field_number >= (2 << 14)) {
    return false;
  }

  // - Field numbers are relatively dense within the actual number of fields
  if (max_field_number * table_sparseness >= descriptor->field_count()) {
    return false;
  }

  // - This is not a MapEntryMessage.
  if (IsMapEntryMessage(descriptor)) {
    return false;
  }

  return true;
}